

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::and_d8(SM83 *this)

{
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_char_&>
  fmt;
  byte local_11;
  SM83 *pSStack_10;
  u8 value;
  SM83 *this_local;
  
  pSStack_10 = this;
  local_11 = GetByteFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4a;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  AND 0x{:02X}\n",
             fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&local_11,(uchar *)this);
  (this->field_0).field_1.a = (this->field_0).field_1.a & local_11;
  SetZeroFlag(this,(this->field_0).field_1.a == '\0');
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,true);
  SetCarryFlag(this,false);
  return;
}

Assistant:

void SM83::and_d8() {
    u8 value = GetByteFromPC();
    LTRACE("AND 0x{:02X}", value);

    a &= value;

    SetZeroFlag(a == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(true);
    SetCarryFlag(false);
}